

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  ushort *puVar1;
  FeatureSet *from;
  byte bVar2;
  EnumValueDescriptor *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>_>
  *pVVar3;
  ReservedRange *pRVar4;
  EnumOptions *this_01;
  EnumOptions *pEVar5;
  FeatureSet *this_02;
  Arena *arena;
  int i;
  int iVar6;
  int i_2;
  long lVar7;
  string_view value;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  puVar1 = (ushort *)(this->all_names_).payload_;
  value._M_len = (ulong)*puVar1;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = (char *)((long)puVar1 + ~value._M_len);
  arena = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,arena);
  for (iVar6 = 0; iVar6 < this->value_count_; iVar6 = iVar6 + 1) {
    this_00 = EnumDescriptor::value(this,iVar6);
    proto_00 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                         (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase);
    EnumValueDescriptor::CopyTo(this_00,proto_00);
  }
  for (iVar6 = 0; iVar6 < this->reserved_range_count_; iVar6 = iVar6 + 1) {
    pVVar3 = internal::RepeatedPtrFieldBase::
             Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                       (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase);
    pRVar4 = reserved_range(this,iVar6);
    (pVVar3->field_0)._impl_.start_ = pRVar4->start;
    *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 1;
    pRVar4 = reserved_range(this,iVar6);
    (pVVar3->field_0)._impl_.end_ = pRVar4->end;
    *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 2;
  }
  for (lVar7 = 0; lVar7 < this->reserved_name_count_; lVar7 = lVar7 + 1) {
    local_40._M_str = (this->reserved_names_[lVar7]->_M_dataplus)._M_p;
    local_40._M_len = this->reserved_names_[lVar7]->_M_string_length;
    internal::AddToRepeatedPtrField<std::basic_string_view<char,std::char_traits<char>>>
              (&(proto->field_0)._impl_.reserved_name_,&local_40);
  }
  bVar2 = (byte)this->field_0x1 >> 2;
  if ((bVar2 & 3) != 0) {
    EnumDescriptorProto::set_visibility(proto,bVar2 & (VISIBILITY_EXPORT|VISIBILITY_LOCAL));
  }
  pEVar5 = this->options_;
  if (pEVar5 != (EnumOptions *)_EnumOptions_default_instance_) {
    this_01 = EnumDescriptorProto::mutable_options(proto);
    EnumOptions::CopyFrom(this_01,pEVar5);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)&_FeatureSet_default_instance_) {
    pEVar5 = EnumDescriptorProto::mutable_options(proto);
    this_02 = EnumOptions::mutable_features(pEVar5);
    FeatureSet::CopyFrom(this_02,from);
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    EnumDescriptorProto::EnumReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (visibility_keyword() != SymbolVisibility::VISIBILITY_UNSET) {
    proto->set_visibility(visibility_keyword());
  }

  if (&options() != &EnumOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}